

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O1

DdApaDigit Cudd_ApaSubtract(int digits,DdApaNumber a,DdApaNumber b,DdApaNumber diff)

{
  ulong uVar1;
  long lVar2;
  
  if (0 < digits) {
    lVar2 = (ulong)(uint)digits + 1;
    uVar1 = 0x100000000;
    do {
      uVar1 = ((uVar1 >> 0x20) + 0xffffffff + (ulong)a[lVar2 + -2]) - (ulong)b[lVar2 + -2];
      diff[lVar2 + -2] = (DdApaDigit)uVar1;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
    return (int)(uVar1 >> 0x20) - 1;
  }
  return 0;
}

Assistant:

DdApaDigit
Cudd_ApaSubtract(
  int  digits,
  DdApaNumber  a,
  DdApaNumber  b,
  DdApaNumber  diff)
{
    int i;
    DdApaDoubleDigit partial = DD_APA_BASE;

    for (i = digits - 1; i >= 0; i--) {
        partial = DD_MSDIGIT(partial) + DD_APA_MASK + a[i] - b[i];
        diff[i] = (DdApaDigit) DD_LSDIGIT(partial);
    }
    return((DdApaDigit) DD_MSDIGIT(partial) - 1);

}